

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

bool __thiscall
gl4cts::GPUShaderFP64Test7::executeFunctionalTest(GPUShaderFP64Test7 *this,_variables *variables)

{
  ostringstream *poVar1;
  uchar *puVar2;
  pointer p_Var3;
  pointer p_Var4;
  bool bVar5;
  int iVar6;
  deUint32 dVar7;
  undefined4 extraout_var;
  MessageBuilder *this_00;
  _variable_type type;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  string local_1d0;
  undefined1 local_1b0 [384];
  
  bVar5 = buildTestProgram(this,variables);
  if (bVar5) {
    if (this->m_are_double_inputs_supported == true) {
      setInputAttributeValues(this,variables);
    }
    configureXFBBuffer(this,variables);
    iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar13 = CONCAT44(extraout_var,iVar6);
    (**(code **)(lVar13 + 0x1c0))(0x3f800000,0x3f800000,0x3f800000,0x3f800000);
    dVar7 = (**(code **)(lVar13 + 0x800))();
    glu::checkError(dVar7,"glClearColor() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x23df);
    (**(code **)(lVar13 + 0x188))(0x4000);
    dVar7 = (**(code **)(lVar13 + 0x800))();
    glu::checkError(dVar7,"glClear() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x23e2);
    (**(code **)(lVar13 + 0x1680))(this->m_po_id);
    dVar7 = (**(code **)(lVar13 + 0x800))();
    glu::checkError(dVar7,"glUseProgram() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x23e5);
    (**(code **)(lVar13 + 0x1a00))(0,0,this->m_to_width,this->m_to_height);
    dVar7 = (**(code **)(lVar13 + 0x800))();
    glu::checkError(dVar7,"glViewport() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x23ea);
    (**(code **)(lVar13 + 0x30))(4);
    dVar7 = (**(code **)(lVar13 + 0x800))();
    glu::checkError(dVar7,"glBeginTransformFeedback() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x23ed);
    (**(code **)(lVar13 + 0x538))(0xe,0,4);
    dVar7 = (**(code **)(lVar13 + 0x800))();
    glu::checkError(dVar7,"glDrawArrays() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x23f0);
    (**(code **)(lVar13 + 0x638))();
    dVar7 = (**(code **)(lVar13 + 0x800))();
    glu::checkError(dVar7,"glEndTransformFeedback() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x23f3);
    (**(code **)(lVar13 + 0x1220))
              (0,0,this->m_to_width,this->m_to_height,0x1908,0x1401,this->m_to_data);
    dVar7 = (**(code **)(lVar13 + 0x800))();
    glu::checkError(dVar7,"glReadPixels() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x23f9);
    puVar2 = this->m_to_data;
    for (uVar10 = 0; uVar10 != this->m_to_height; uVar10 = uVar10 + 1) {
      uVar8 = this->m_to_width * 4 * (int)uVar10;
      for (uVar12 = 0; uVar12 != this->m_to_width; uVar12 = uVar12 + 1) {
        uVar9 = (ulong)(uint)((int)uVar12 * 4);
        if ((((puVar2[uVar9 + uVar8] != '\0') || (puVar2[uVar9 + (ulong)uVar8 + 1] != 0xff)) ||
            (puVar2[uVar9 + (ulong)uVar8 + 2] != '\0')) ||
           (puVar2[uVar9 + (ulong)uVar8 + 3] != '\0')) {
          local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          poVar1 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::operator<<((ostream *)poVar1,"Invalid pixel found at (");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::operator<<((ostream *)poVar1,", ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::operator<<((ostream *)poVar1,"); expected:(0, 255, 0, 0), found: (");
          std::ostream::operator<<(poVar1,(uint)puVar2[uVar9 + uVar8]);
          std::operator<<((ostream *)poVar1,", ");
          std::ostream::operator<<(poVar1,(uint)puVar2[uVar9 + (ulong)uVar8 + 1]);
          std::operator<<((ostream *)poVar1,", ");
          std::ostream::operator<<(poVar1,(uint)puVar2[uVar9 + (ulong)uVar8 + 2]);
          std::operator<<((ostream *)poVar1,", ");
          std::ostream::operator<<(poVar1,(uint)puVar2[uVar9 + (ulong)uVar8 + 3]);
          std::operator<<((ostream *)poVar1,"), with the following variable types used as varyings:"
                         );
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          p_Var3 = (variables->
                   super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          p_Var4 = (variables->
                   super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          lVar13 = 4;
          poVar1 = (ostringstream *)(local_1b0 + 8);
          for (lVar11 = 0; ((long)p_Var3 - (long)p_Var4) / 0xc != lVar11; lVar11 = lVar11 + 1) {
            local_1b0._0_8_ =
                 ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::operator<<((ostream *)poVar1,"gs_variable");
            std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            std::operator<<((ostream *)poVar1,": ");
            Utils::getVariableTypeString_abi_cxx11_
                      (&local_1d0,
                       (Utils *)(ulong)*(uint *)((long)&((variables->
                                                                                                                  
                                                  super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  array_size + lVar13),type);
            std::operator<<((ostream *)poVar1,(string *)&local_1d0);
            std::operator<<((ostream *)poVar1," (array size:");
            this_00 = tcu::MessageBuilder::operator<<
                                ((MessageBuilder *)local_1b0,
                                 (uint *)((long)&((variables->
                                                  super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                 attribute_location + lVar13));
            std::operator<<(&(this_00->m_str).super_basic_ostream<char,_std::char_traits<char>_>,")"
                           );
            tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::string::~string((string *)&local_1d0);
            std::__cxx11::ostringstream::~ostringstream(poVar1);
            lVar13 = lVar13 + 0xc;
          }
          logVariableContents(this,variables);
          local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          poVar1 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::operator<<((ostream *)poVar1,"Shaders used:\n\n(VS):\n");
          std::operator<<((ostream *)poVar1,(this->m_current_vs_body)._M_dataplus._M_p);
          std::operator<<((ostream *)poVar1,"\n");
          std::operator<<((ostream *)poVar1,"(TC):\n\n");
          std::operator<<((ostream *)poVar1,(this->m_current_tc_body)._M_dataplus._M_p);
          std::operator<<((ostream *)poVar1,"\n(TE):\n\n");
          std::operator<<((ostream *)poVar1,(this->m_current_te_body)._M_dataplus._M_p);
          std::operator<<((ostream *)poVar1,"\n(GS):\n");
          std::operator<<((ostream *)poVar1,(this->m_current_gs_body)._M_dataplus._M_p);
          std::operator<<((ostream *)poVar1,"\n(FS):\n\n");
          std::operator<<((ostream *)poVar1,(this->m_current_fs_body)._M_dataplus._M_p);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          goto LAB_009e89d1;
        }
      }
    }
    bVar5 = true;
  }
  else {
LAB_009e89d1:
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool GPUShaderFP64Test7::executeFunctionalTest(_variables& variables)
{
	bool result = true;

	/* Build the test program */
	if (!buildTestProgram(variables))
	{
		return false;
	}

	/* Set up input attributes if GL_ARB_vertex_attrib_64bit extension is supported */
	if (m_are_double_inputs_supported)
	{
		setInputAttributeValues(variables);
	}

	/* Set up buffer object to hold XFB data. The data will be used for logging purposes
	 * only, if a data mismatch is detected.
	 */
	configureXFBBuffer(variables);

	/* Issue a draw call using the test program */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.clearColor(1.0f, 1.0f, 1.0f, 1.0f);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glClearColor() call failed.");

	gl.clear(GL_COLOR_BUFFER_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glClear() call failed.");

	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

	gl.viewport(0, /* x */
				0, /* y */
				m_to_width, m_to_height);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glViewport() call failed.");

	gl.beginTransformFeedback(GL_TRIANGLES);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback() call failed.");
	{
		gl.drawArrays(GL_PATCHES, 0 /* first */, 4 /* count */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() call failed.");
	}
	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() call failed.");

	/* Verify color attachment contents */
	const float epsilon = 1.0f / 255.0f;

	gl.readPixels(0 /* x */, 0 /* y */, m_to_width, m_to_height, GL_RGBA, GL_UNSIGNED_BYTE, m_to_data);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels() call failed.");

	for (unsigned int y = 0; y < m_to_height; ++y)
	{
		const unsigned char* row_ptr = m_to_data + 4 /* rgba */ * m_to_width * y;

		for (unsigned int x = 0; x < m_to_width; ++x)
		{
			const unsigned char* pixel_ptr = row_ptr + 4 /* rgba */ * x;

			if (de::abs(pixel_ptr[0]) > epsilon || de::abs(pixel_ptr[1] - 255) > epsilon ||
				de::abs(pixel_ptr[2]) > epsilon || de::abs(pixel_ptr[3]) > epsilon)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Invalid pixel found at (" << x << ", " << y
								   << ")"
									  "; expected:(0, 255, 0, 0), found: ("
								   << (int)pixel_ptr[0] << ", " << (int)pixel_ptr[1] << ", " << (int)pixel_ptr[2]
								   << ", " << (int)pixel_ptr[3]
								   << "), with the following variable types used as varyings:"
								   << tcu::TestLog::EndMessage;

				/* List the variable types that failed the test */
				const size_t n_variables = variables.size();

				for (size_t n_variable = 0; n_variable < n_variables; ++n_variable)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "gs_variable" << n_variable << ": "
									   << Utils::getVariableTypeString(variables[n_variable].type)
									   << " (array size:" << variables[n_variable].array_size << ")"
									   << tcu::TestLog::EndMessage;
				} /* for (all variable types) */

				/* Log the variable contents */
				logVariableContents(variables);

				/* Log shaders used for the iteration */
				m_testCtx.getLog() << tcu::TestLog::Message << "Shaders used:\n"
															   "\n"
															   "(VS):\n"
								   << m_current_vs_body.c_str() << "\n"
								   << "(TC):\n"
									  "\n"
								   << m_current_tc_body.c_str() << "\n"
																   "(TE):\n"
																   "\n"
								   << m_current_te_body.c_str() << "\n"
																   "(GS):\n"
								   << m_current_gs_body.c_str() << "\n"
																   "(FS):\n"
																   "\n"
								   << m_current_fs_body.c_str() << tcu::TestLog::EndMessage;

				result = false;

				goto end;
			}
		} /* for (all columns) */
	}	 /* for (all rows) */

/* All done! */
end:
	return result;
}